

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_security_factory.c
# Opt level: O3

void iothub_security_deinit(void)

{
  char *pcVar1;
  
  if (g_symm_key != (char *)0x0) {
    free(g_symm_key);
    g_symm_key = (char *)0x0;
  }
  if (g_symm_key_reg_name != (char *)0x0) {
    free(g_symm_key_reg_name);
    g_symm_key_reg_name = (char *)0x0;
  }
  deinitialize_hsm_system();
  pcVar1 = prov_dev_get_symmetric_key();
  if (pcVar1 == (char *)0x0) {
    pcVar1 = prov_dev_get_symm_registration_name();
    if (pcVar1 == (char *)0x0) {
      return;
    }
  }
  prov_dev_security_deinit();
  return;
}

Assistant:

void iothub_security_deinit()
{
    if (g_symm_key != NULL)
    {
        free(g_symm_key);
        g_symm_key = NULL;
    }
    if (g_symm_key_reg_name != NULL)
    {
        free(g_symm_key_reg_name);
        g_symm_key_reg_name = NULL;
    }
    deinitialize_hsm_system();
    if (prov_dev_get_symmetric_key() != NULL || prov_dev_get_symm_registration_name() != NULL)
    {
        prov_dev_security_deinit();
    }
}